

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

LoopEvent rec_for(jit_State *J,BCIns *fori,int isforl)

{
  uint uVar1;
  uint dir;
  TRef TVar2;
  LoopEvent LVar3;
  jit_State *J_00;
  BCIns *fori_00;
  IRType in_EDX;
  jit_State *in_RSI;
  TValue *in_RDI;
  BCReg i;
  ScEvEntry scev;
  TRef idx;
  IRType t;
  TRef stop;
  LoopEvent ev;
  IROp op;
  TRef *tr;
  TValue *tv;
  BCReg ra;
  int32_t in_stack_ffffffffffffff4c;
  TValue *in_stack_ffffffffffffff50;
  IRType in_stack_ffffffffffffff58;
  IRType in_stack_ffffffffffffff5c;
  uint local_a0;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6c;
  undefined2 in_stack_ffffffffffffff6e;
  IRType in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  IRType local_88;
  undefined2 uVar4;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  
  dir = (in_RSI->cur).nextgc.gcptr32 >> 8 & 0xff;
  J_00 = (jit_State *)(*(long *)(in_RDI[0xc].u64 + 0x10) + (ulong)dir * 8);
  fori_00 = (BCIns *)(in_RDI[0x10].u64 + (ulong)dir * 4);
  if (in_EDX == IRT_NIL) {
    lj_meta_for((lua_State *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                in_stack_ffffffffffffff50);
    if ((*fori_00 & 0x1f000000) == 0x13000000) {
      local_88 = lj_opt_narrow_forl((jit_State *)
                                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                    in_stack_ffffffffffffff50);
    }
    else {
      local_88 = IRT_NUM;
    }
    in_stack_ffffffffffffff5c = local_88;
    for (local_a0 = 0; local_a0 < 3; local_a0 = local_a0 + 1) {
      if (fori_00[local_a0] == 0) {
        sload((jit_State *)&in_stack_ffffffffffffff50->field_2,in_stack_ffffffffffffff4c);
      }
      if ((fori_00[local_a0] & 0x1f000000) == 0x4000000) {
        uVar1 = fori_00[local_a0];
        *(undefined2 *)((long)in_RDI + 0x9c) = 0x588e;
        *(short *)(in_RDI + 0x13) = (short)uVar1;
        *(undefined2 *)((long)in_RDI + 0x9a) = 0;
        TVar2 = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        fori_00[local_a0] = TVar2;
      }
      if (local_88 == IRT_INT) {
        if (4 < (fori_00[local_a0] >> 0x18 & 0x1f) - 0xf) {
          uVar1 = fori_00[local_a0];
          *(undefined2 *)((long)in_RDI + 0x9c) = 0x5593;
          *(short *)(in_RDI + 0x13) = (short)uVar1;
          *(undefined2 *)((long)in_RDI + 0x9a) = 0x326e;
          TVar2 = lj_opt_fold((jit_State *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          fori_00[local_a0] = TVar2;
        }
      }
      else if ((fori_00[local_a0] & 0x1f000000) != 0xe000000) {
        uVar1 = fori_00[local_a0];
        *(undefined2 *)((long)in_RDI + 0x9c) = 0x550e;
        *(short *)(in_RDI + 0x13) = (short)uVar1;
        *(undefined2 *)((long)in_RDI + 0x9a) = 0x1d3;
        TVar2 = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        fori_00[local_a0] = TVar2;
      }
    }
    fori_00[3] = *fori_00;
    uVar4 = (undefined2)fori_00[1];
    in_stack_ffffffffffffff50 = in_RDI;
    in_stack_ffffffffffffff58 = local_88;
    rec_for_direction((cTValue *)&(J_00->cur).ir);
    rec_for_check(in_RSI,in_EDX,dir,(TRef)((ulong)J_00 >> 0x20),(TRef)J_00,
                  (int)((ulong)fori_00 >> 0x20));
  }
  else {
    in_stack_ffffffffffffff74 = *fori_00;
    if (((jit_State *)(ulong)*(uint *)((long)in_RDI + 0x93c) == in_RSI) &&
       ((in_stack_ffffffffffffff74 & 0xffff) == (uint)*(ushort *)(in_RDI + 0x128))) {
      local_88 = (IRType)*(byte *)(in_RDI + 0x129);
      uVar4 = *(undefined2 *)((long)in_RDI + 0x944);
      *(ushort *)((long)in_RDI + 0x9c) = *(byte *)(in_RDI + 0x129) | 0x2800;
      *(short *)(in_RDI + 0x13) = (short)in_stack_ffffffffffffff74;
      *(undefined2 *)((long)in_RDI + 0x9a) = *(undefined2 *)((long)in_RDI + 0x946);
      in_stack_ffffffffffffff74 =
           lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      *fori_00 = in_stack_ffffffffffffff74;
      fori_00[3] = in_stack_ffffffffffffff74;
    }
    else {
      rec_for_loop(J_00,fori_00,
                   (ScEvEntry *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
      local_88 = in_stack_ffffffffffffff70 & IRT_T;
      uVar4 = in_stack_ffffffffffffff6c;
    }
  }
  LVar3 = rec_for_iter((IROp *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (cTValue *)
                       CONCAT26(in_stack_ffffffffffffff6e,
                                CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
                       in_stack_ffffffffffffff64);
  if (LVar3 == LOOPEV_LEAVE) {
    *(uint *)((long)in_RDI + 0x8c) = dir + 4;
    in_RDI[0xd].u64 = (uint64_t)&(in_RSI->cur).marked;
  }
  else {
    *(uint *)((long)in_RDI + 0x8c) = dir;
    in_RDI[0xd].u64 =
         (long)in_RSI + ((ulong)((in_RSI->cur).nextgc.gcptr32 >> 0x10) - 0x8000) * 4 + 4;
  }
  lj_snap_add((jit_State *)&in_stack_ffffffffffffff50->field_2);
  uVar1 = *fori_00;
  *(ushort *)((long)in_RDI + 0x9c) =
       (ushort)(in_stack_ffffffffffffff84 << 8) | (ushort)local_88 | 0x80;
  *(short *)(in_RDI + 0x13) = (short)uVar1;
  *(undefined2 *)((long)in_RDI + 0x9a) = uVar4;
  lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (LVar3 == LOOPEV_LEAVE) {
    *(uint *)((long)in_RDI + 0x8c) = dir;
    in_RDI[0xd].u64 =
         (long)in_RSI + ((ulong)((in_RSI->cur).nextgc.gcptr32 >> 0x10) - 0x8000) * 4 + 4;
  }
  else {
    *(uint *)((long)in_RDI + 0x8c) = dir + 4;
    in_RDI[0xd].u64 = (uint64_t)&(in_RSI->cur).marked;
  }
  *(undefined1 *)((long)in_RDI + 0x95) = 1;
  return LVar3;
}

Assistant:

static LoopEvent rec_for(jit_State *J, const BCIns *fori, int isforl)
{
  BCReg ra = bc_a(*fori);
  TValue *tv = &J->L->base[ra];
  TRef *tr = &J->base[ra];
  IROp op;
  LoopEvent ev;
  TRef stop;
  IRType t;
  if (isforl) {  /* Handle FORL/JFORL opcodes. */
    TRef idx = tr[FORL_IDX];
    if (mref(J->scev.pc, const BCIns) == fori && tref_ref(idx) == J->scev.idx) {
      t = J->scev.t.irt;
      stop = J->scev.stop;
      idx = emitir(IRT(IR_ADD, t), idx, J->scev.step);
      tr[FORL_EXT] = tr[FORL_IDX] = idx;
    } else {
      ScEvEntry scev;
      rec_for_loop(J, fori, &scev, 0);
      t = scev.t.irt;
      stop = scev.stop;
    }
  } else {  /* Handle FORI/JFORI opcodes. */
    BCReg i;
    lj_meta_for(J->L, tv);
    t = (LJ_DUALNUM || tref_isint(tr[FORL_IDX])) ? lj_opt_narrow_forl(J, tv) :
						   IRT_NUM;
    for (i = FORL_IDX; i <= FORL_STEP; i++) {
      if (!tr[i]) sload(J, ra+i);
      lua_assert(tref_isnumber_str(tr[i]));
      if (tref_isstr(tr[i]))
	tr[i] = emitir(IRTG(IR_STRTO, IRT_NUM), tr[i], 0);
      if (t == IRT_INT) {
	if (!tref_isinteger(tr[i]))
	  tr[i] = emitir(IRTGI(IR_CONV), tr[i], IRCONV_INT_NUM|IRCONV_CHECK);
      } else {
	if (!tref_isnum(tr[i]))
	  tr[i] = emitir(IRTN(IR_CONV), tr[i], IRCONV_NUM_INT);
      }
    }
    tr[FORL_EXT] = tr[FORL_IDX];
    stop = tr[FORL_STOP];
    rec_for_check(J, t, rec_for_direction(&tv[FORL_STEP]),
		  stop, tr[FORL_STEP], 1);
  }

  ev = rec_for_iter(&op, tv, isforl);
  if (ev == LOOPEV_LEAVE) {
    J->maxslot = ra+FORL_EXT+1;
    J->pc = fori+1;
  } else {
    J->maxslot = ra;
    J->pc = fori+bc_j(*fori)+1;
  }
  lj_snap_add(J);

  emitir(IRTG(op, t), tr[FORL_IDX], stop);

  if (ev == LOOPEV_LEAVE) {
    J->maxslot = ra;
    J->pc = fori+bc_j(*fori)+1;
  } else {
    J->maxslot = ra+FORL_EXT+1;
    J->pc = fori+1;
  }
  J->needsnap = 1;
  return ev;
}